

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

axbStatus_t
host_copyin(void *src,axbDataType_t src_type,void *dest,axbDataType_t dest_type,size_t n,
           void *aux_data)

{
  undefined8 local_70;
  size_t i_1;
  double *d_dest_1;
  double *d_src_1;
  size_t i;
  int *d_dest;
  int *d_src;
  void *aux_data_local;
  size_t n_local;
  axbDataType_t dest_type_local;
  void *dest_local;
  axbDataType_t src_type_local;
  void *src_local;
  
  if ((src_type == AXB_INT_32) || (src_type == AXB_REAL_DOUBLE)) {
    if ((dest_type == AXB_INT_32) || (dest_type == AXB_REAL_DOUBLE)) {
      if (src_type == dest_type) {
        if (src_type == AXB_INT_32) {
          for (d_src_1 = (double *)0x0; d_src_1 < n; d_src_1 = (double *)((long)d_src_1 + 1)) {
            *(undefined4 *)((long)dest + (long)d_src_1 * 4) =
                 *(undefined4 *)((long)src + (long)d_src_1 * 4);
          }
        }
        else if (src_type == AXB_REAL_DOUBLE) {
          for (local_70 = 0; local_70 < n; local_70 = local_70 + 1) {
            *(undefined8 *)((long)dest + local_70 * 8) = *(undefined8 *)((long)src + local_70 * 8);
          }
        }
        src_local._4_4_ = 0;
      }
      else {
        src_local._4_4_ = 0x40d0;
      }
    }
    else {
      src_local._4_4_ = 0x40cf;
    }
  }
  else {
    src_local._4_4_ = 0x40ce;
  }
  return src_local._4_4_;
}

Assistant:

static axbStatus_t host_copyin(void *src, axbDataType_t src_type, void *dest, axbDataType_t dest_type, size_t n, void *aux_data)
{
  if ( src_type != AXB_INT_32 &&  src_type != AXB_REAL_DOUBLE) return 16590; // not yet supported
  if (dest_type != AXB_INT_32 && dest_type != AXB_REAL_DOUBLE) return 16591; // not yet supported
  if ( src_type != dest_type) return 16592; // not yet supported

  if (src_type == AXB_INT_32) {
    int *d_src  = src;
    int *d_dest = dest;
    for (size_t i=0; i<n; ++i)
      d_dest[i] = d_src[i];
  } else if (src_type == AXB_REAL_DOUBLE) {
    double *d_src  = src;
    double *d_dest = dest;
    for (size_t i=0; i<n; ++i)
      d_dest[i] = d_src[i];
  }

  (void)aux_data;
  return 0;
}